

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_setup.cpp
# Opt level: O0

void PeleLM::rhoydotSetUp(void)

{
  Print *this;
  Print *interp;
  Print *pPVar1;
  char *pcVar2;
  string name;
  int i;
  BCRec bc;
  BndryFunc pelelm_bndryfunc;
  int nrhoydot;
  int ngrow;
  char (*in_stack_fffffffffffffcd8) [26];
  undefined1 *inFunc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 uVar3;
  uint in_stack_fffffffffffffce4;
  int iVar4;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffcf0;
  int iVar5;
  undefined4 in_stack_fffffffffffffcf4;
  int iVar6;
  allocator *this_00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  Print *in_stack_fffffffffffffd10;
  undefined2 uVar7;
  InterpBase *interp_00;
  undefined8 in_stack_fffffffffffffd18;
  BndryFunc *this_01;
  TimeCenter in_stack_fffffffffffffd20;
  undefined4 uVar8;
  DescriptorList *in_stack_fffffffffffffd28;
  BCRec *this_02;
  IndexType typ;
  allocator local_2a1;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [36];
  int local_23c;
  BCRec local_238;
  InterpBase local_220 [4];
  BndryFunc local_200;
  uint local_1ac;
  undefined1 local_1a6;
  undefined1 local_1a5;
  int local_c;
  undefined4 local_8;
  IndexType local_4;
  
  RhoYdot_Type = amrex::DescriptorList::size((DescriptorList *)0x71c583);
  local_8 = 1;
  local_c = 0x15;
  amrex::OutStream();
  amrex::Print::Print(in_stack_fffffffffffffd10,
                      (ostream *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  uVar7 = (undefined2)((ulong)in_stack_fffffffffffffd10 >> 0x30);
  this = amrex::Print::operator<<
                   ((Print *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcd8);
  interp = amrex::Print::operator<<
                     ((Print *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                      (int *)in_stack_fffffffffffffcd8);
  local_1a5 = 0x20;
  amrex::Print::operator<<
            ((Print *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             *in_stack_fffffffffffffcd8);
  pPVar1 = amrex::Print::operator<<
                     ((Print *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                      (int *)in_stack_fffffffffffffcd8);
  typ.itype = (uint)((ulong)pPVar1 >> 0x20);
  local_1a6 = 10;
  amrex::Print::operator<<
            ((Print *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             *in_stack_fffffffffffffcd8);
  amrex::Print::~Print(this);
  amrex::IndexType::IndexType(&local_4,CELL,CELL,CELL);
  local_1ac = local_4.itype;
  inFunc = amrex::eb_mf_cell_cons_interp;
  iVar4 = 1;
  uVar3 = 0;
  uVar8 = 1;
  amrex::DescriptorList::addDescriptor
            (in_stack_fffffffffffffd28,1,typ,in_stack_fffffffffffffd20,
             (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),(int)in_stack_fffffffffffffd18,
             (InterpBase *)interp,SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0));
  interp_00 = local_220;
  std::
  function<void(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)>
  ::
  function<void(&)(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int),void>
            ((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int)>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (_func_void_Box_ptr_FArrayBox_ptr_int_int_Geometry_ptr_double_Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_ptr_int_int
              *)CONCAT44(in_stack_fffffffffffffcec,iVar4));
  this_01 = &local_200;
  amrex::StateDescriptor::BndryFunc::BndryFunc
            ((BndryFunc *)CONCAT44(in_stack_fffffffffffffce4,uVar3),(BndryFuncFabDefault *)inFunc);
  std::
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int)>
  ::~function((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::Geometry_&,_double,_const_amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>_&,_int,_int)>
               *)0x71c706);
  amrex::StateDescriptor::BndryFunc::setRunOnGPU(this_01,SUB41(uVar8,0));
  this_02 = &local_238;
  amrex::BCRec::BCRec(this_02);
  set_rhoydot_bc(this_02,&NavierStokesBase::phys_bc);
  for (local_23c = 0; local_23c < local_c; local_23c = local_23c + 1) {
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffce4,uVar3),(size_type)inFunc);
    std::operator+((char *)this_02,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar8,in_stack_fffffffffffffd20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcec,iVar4),
                   (char *)CONCAT44(in_stack_fffffffffffffce4,uVar3));
    std::__cxx11::string::~string(local_280);
    iVar5 = RhoYdot_Type;
    iVar6 = local_23c;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    this_00 = &local_2a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,pcVar2,this_00);
    iVar4 = local_c + -1;
    inFunc = amrex::eb_mf_cell_cons_interp;
    uVar3 = 0;
    amrex::DescriptorList::setComponent
              ((DescriptorList *)this_00,(int)((ulong)pcVar2 >> 0x20),(int)pcVar2,
               (string *)CONCAT44(iVar6,iVar5),(BCRec *)CONCAT44(in_stack_fffffffffffffcec,iVar4),
               (BndryFunc *)((ulong)in_stack_fffffffffffffce4 << 0x20),interp_00,(int)this_01,
               in_stack_fffffffffffffd20);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    std::__cxx11::string::~string(local_260);
  }
  amrex::StateDescriptor::BndryFunc::~BndryFunc((BndryFunc *)0x71c952);
  return;
}

Assistant:

void
PeleLM::rhoydotSetUp()
{
  RhoYdot_Type       = desc_lst.size();
  const int ngrow = 1;
  int nrhoydot = NUM_SPECIES;

  amrex::Print() << "RhoYdot_Type, nrhoydot = " << RhoYdot_Type << ' ' << nrhoydot << '\n';

  desc_lst.addDescriptor(RhoYdot_Type,IndexType::TheCellType(),
                         StateDescriptor::Point,ngrow,nrhoydot,
                         &cc_interp);


  amrex::StateDescriptor::BndryFunc pelelm_bndryfunc(pelelm_dummy_fill);
  pelelm_bndryfunc.setRunOnGPU(true);  // I promise the bc function will launch gpu kernels.

	
  //const StateDescriptor& d_cell = desc_lst[State_Type];

  BCRec bc;	
  set_rhoydot_bc(bc,phys_bc);
  for (int i = 0; i < nrhoydot; i++)
  {
    const std::string name = "I_R[rhoY("+spec_names[i]+")]";
    desc_lst.setComponent(RhoYdot_Type, i, name.c_str(), bc,
                          pelelm_bndryfunc, &cc_interp, 0, nrhoydot-1);
  }
}